

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O3

void tsgSetConformalTransformASIN(void *grid,int *truncation)

{
  long lVar1;
  allocator_type local_29;
  vector<int,_std::allocator<int>_> local_28;
  
  if (*(long *)((long)grid + 8) == 0) {
    lVar1 = 0;
  }
  else {
    lVar1 = (long)*(int *)(*(long *)((long)grid + 8) + 0x10);
  }
  if (truncation == (int *)0x0) {
    local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_28,truncation,truncation + lVar1,&local_29)
    ;
  }
  TasGrid::TasmanianSparseGrid::setConformalTransformASIN((TasmanianSparseGrid *)grid,&local_28);
  if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void tsgSetConformalTransformASIN(void *grid, const int truncation[]){
    ((TasmanianSparseGrid*) grid)->setConformalTransformASIN(Utils::copyArray(truncation, ((TasmanianSparseGrid*) grid)->getNumDimensions()));
}